

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRHS.cpp
# Opt level: O3

void __thiscall
HDualRHS::update_weight(HDualRHS *this,HVector *column,double devex,double Kai,double *dseArray)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  HModel *pHVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer pdVar7;
  undefined8 uVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined4 uVar11;
  ulong uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  
  uVar8 = rdtsc();
  uVar11 = (undefined4)((ulong)uVar8 >> 0x20);
  auVar9._4_4_ = uVar11;
  auVar9._0_4_ = uVar11;
  auVar9._8_4_ = 0;
  auVar15._0_12_ = auVar9 << 0x20;
  auVar15._12_4_ = 0x45300000;
  (this->workModel->timer).itemStart[0x17] =
       (auVar15._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
  pHVar4 = this->workModel;
  uVar1 = pHVar4->numRow;
  iVar2 = column->count;
  pdVar5 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)iVar2 < 0) || ((double)(int)uVar1 * 0.4 < (double)iVar2)) {
    if (0 < (int)uVar1) {
      pdVar7 = (this->workEdWt).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = 0;
      do {
        dVar16 = pdVar5[uVar12];
        dVar17 = (devex * dVar16 + dseArray[uVar12] * Kai) * dVar16 + pdVar7[uVar12];
        dVar16 = 0.0001;
        if (0.0001 <= dVar17) {
          dVar16 = dVar17;
        }
        pdVar7[uVar12] = dVar16;
        uVar12 = uVar12 + 1;
      } while (uVar1 != uVar12);
    }
  }
  else if (iVar2 != 0) {
    piVar6 = (column->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->workEdWt).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar13 = 0;
    do {
      iVar3 = piVar6[lVar13];
      dVar16 = pdVar5[iVar3];
      dVar17 = (devex * dVar16 + dseArray[iVar3] * Kai) * dVar16 + pdVar7[iVar3];
      dVar16 = 0.0001;
      if (0.0001 <= dVar17) {
        dVar16 = dVar17;
      }
      pdVar7[iVar3] = dVar16;
      lVar13 = lVar13 + 1;
    } while (iVar2 != lVar13);
  }
  uVar8 = rdtsc();
  uVar11 = (undefined4)((ulong)uVar8 >> 0x20);
  auVar10._4_4_ = uVar11;
  auVar10._0_4_ = uVar11;
  auVar10._8_4_ = 0;
  auVar14._0_12_ = auVar10 << 0x20;
  auVar14._12_4_ = 0x45300000;
  (pHVar4->timer).itemTicks[0x17] =
       (((auVar14._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) -
       (pHVar4->timer).itemStart[0x17]) + (pHVar4->timer).itemTicks[0x17];
  return;
}

Assistant:

void HDualRHS::update_weight(HVector *column, double devex, double Kai,
        double *dseArray) {
    workModel->timer.recordStart(HTICK_UPDATE_WEIGHT);

    const int numRow = workModel->getNumRow();
    const int columnCount = column->count;
    const int *columnIndex = &column->index[0];
    const double *columnArray = &column->array[0];

    bool updateWeight_inDense = columnCount < 0 || columnCount > 0.4 * numRow;
    if (updateWeight_inDense) {
        for (int iRow = 0; iRow < numRow; iRow++) {
            const double val = columnArray[iRow];
            workEdWt[iRow] += val * (devex * val + Kai * dseArray[iRow]);
            if (workEdWt[iRow] < 1e-4)
                workEdWt[iRow] = 1e-4;
        }
    } else {
        for (int i = 0; i < columnCount; i++) {
            const int iRow = columnIndex[i];
            const double val = columnArray[iRow];
            workEdWt[iRow] += val * (devex * val + Kai * dseArray[iRow]);
            if (workEdWt[iRow] < 1e-4)
                workEdWt[iRow] = 1e-4;
        }
    }
    workModel->timer.recordFinish(HTICK_UPDATE_WEIGHT);
}